

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

int64_t c_v256_dotp_s16(c_v256 a,c_v256 b)

{
  c_v128 a_00;
  c_v128 b_00;
  int64_t iVar1;
  int64_t iVar2;
  undefined8 in_stack_00000008;
  
  iVar1 = c_v128_dotp_s16((c_v128)a._8_16_,(c_v128)b._8_16_);
  a_00.u64[1] = a.u64[0];
  a_00.u64[0] = in_stack_00000008;
  b_00.u64[1] = b.u64[0];
  b_00.u64[0] = a.u64[3];
  iVar2 = c_v128_dotp_s16(a_00,b_00);
  return iVar2 + iVar1;
}

Assistant:

SIMD_INLINE int64_t c_v256_dotp_s16(c_v256 a, c_v256 b) {
  return c_v128_dotp_s16(a.v128[1], b.v128[1]) +
         c_v128_dotp_s16(a.v128[0], b.v128[0]);
}